

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall pugi::xml_document::reset(xml_document *this,xml_document *proto)

{
  xml_node local_18;
  
  reset(this);
  local_18 = xml_node::first_child(&proto->super_xml_node);
  while (local_18._root != (xml_node_struct *)0x0) {
    xml_node::append_copy(&this->super_xml_node,&local_18);
    local_18 = xml_node::next_sibling(&local_18);
  }
  return;
}

Assistant:

PUGI__FN void xml_document::reset(const xml_document& proto)
	{
		reset();

		for (xml_node cur = proto.first_child(); cur; cur = cur.next_sibling())
			append_copy(cur);
	}